

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent_p.h
# Opt level: O3

QMouseEvent * __thiscall
QEventStorage<QMouseEvent>::store(QEventStorage<QMouseEvent> *this,QMouseEvent *e)

{
  if (this->m_engaged == true) {
    QMouseEvent::~QMouseEvent((QMouseEvent *)this);
    this->m_engaged = false;
  }
  QMouseEvent::QMouseEvent((QMouseEvent *)this,e);
  this->m_engaged = true;
  return (QMouseEvent *)this;
}

Assistant:

Event &store(const Event &e)
    {
        if (m_engaged)
            disengage();
        engage(e);
        return m_event;
    }